

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O3

void test_AString_replaceRangeAString_success_smallerReplaceLength_fn(int _i)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  char *expr;
  char *pcVar6;
  char **ppcVar7;
  char **ppcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcStack_b0;
  char *pcStack_a8;
  char *pcStack_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined8 uStack_80;
  AString replacement;
  AString string;
  
  string.reallocator = private_ACUtilsTest_AString_realloc;
  string.deallocator = private_ACUtilsTest_AString_free;
  string.size = 8;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_80 = 0x139def;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"012xxx45",9);
  replacement.reallocator = private_ACUtilsTest_AString_realloc;
  replacement.deallocator = private_ACUtilsTest_AString_free;
  replacement.size = 1;
  replacement.capacity = 1;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_80 = 0x139e40;
  replacement.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,2);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  replacement.buffer[0] = '3';
  replacement.buffer[1] = '\0';
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_80 = 0x139e73;
  bVar1 = AString_replaceRangeAString(&string,3,3,&replacement);
  if (bVar1 == false) {
    uStack_80 = 0x13a008;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x69f,
                      "Assertion \'AString_replaceRangeAString(&string, 3, 3, &replacement)\' failed"
                      ,0,0);
  }
  uStack_80 = 0x139e8c;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x69f);
  if (string.capacity == 8) {
    uStack_80 = 0x139eac;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x6a0);
    if (string.buffer == (char *)0x0) {
      ppcVar8 = &local_88;
      pcVar6 = "Assertion \'_ck_x != NULL\' failed";
      pcVar5 = "Assertion \'%s\' failed: %s == %#x";
      pcVar9 = "(void*) (string).buffer != NULL";
      pcVar10 = "(void*) (string).buffer";
      iVar2 = 0x6a0;
      goto LAB_0013a26e;
    }
    uStack_80 = 0x139ec9;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x6a0);
    pcVar10 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pcVar5 = "";
      pcVar10 = "(null)";
    }
    else {
      uStack_80 = 0x139ee6;
      iVar2 = strcmp("012345",string.buffer);
      if (iVar2 == 0) {
        uStack_80 = 0x139eff;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x6a0);
        if (string.size == 6) {
          uStack_80 = 0x139f1f;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x6a0);
          if (replacement.capacity == 1) {
            uStack_80 = 0x139f3f;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x6a1);
            if (replacement.buffer == (char *)0x0) {
              ppcVar8 = &local_88;
              pcVar6 = "Assertion \'_ck_x != NULL\' failed";
              pcVar5 = "Assertion \'%s\' failed: %s == %#x";
              pcVar9 = "(void*) (replacement).buffer != NULL";
              pcVar10 = "(void*) (replacement).buffer";
              iVar2 = 0x6a1;
LAB_0013a26e:
              uStack_80 = 0;
              local_88 = (char *)0x0;
              *(code **)((long)ppcVar8 + -8) =
                   test_AString_replaceRangeAString_success_biggerReplaceLength_fn;
              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,iVar2,pcVar6,pcVar5,pcVar9,pcVar10);
            }
            uStack_80 = 0x139f5c;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x6a1);
            if (replacement.buffer == (char *)0x0) {
              pcStack_b0 = "(null)";
              pcStack_a8 = "";
LAB_0013a19a:
              uStack_80 = 0;
              local_88 = "\"";
              local_90 = "3";
              local_98 = "\"";
              pcStack_a0 = "(\"3\")";
              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x6a1,
                                "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                                "(replacement).buffer == (\"3\")","(replacement).buffer",pcStack_a8)
              ;
            }
            uVar3 = (byte)*replacement.buffer - 0x33;
            if (uVar3 == 0) {
              uVar3 = (uint)(byte)replacement.buffer[1];
            }
            if (uVar3 != 0) {
              pcStack_a8 = "\"";
              pcStack_b0 = replacement.buffer;
              goto LAB_0013a19a;
            }
            uStack_80 = 0x139f93;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x6a1);
            if (replacement.size == 1) {
              uStack_80 = 0x139fb3;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x6a1);
              if (private_ACUtilsTest_AString_reallocCount == 0) {
                uStack_80 = 0x139fd4;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x6a2);
                uStack_80 = 0x139fdd;
                (*string.deallocator)(string.buffer);
                uStack_80 = 0x139fe6;
                (*replacement.deallocator)(replacement.buffer);
                return;
              }
              ppcVar8 = &local_98;
              local_90 = "(0)";
              local_98 = (char *)private_ACUtilsTest_AString_reallocCount;
              pcVar6 = "Assertion \'_ck_x == _ck_y\' failed";
              pcVar5 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
              pcVar9 = "private_ACUtilsTest_AString_reallocCount == (0)";
              pcVar10 = "private_ACUtilsTest_AString_reallocCount";
              iVar2 = 0x6a2;
              goto LAB_0013a26e;
            }
            local_90 = "strlen(\"3\")";
            pcVar6 = "(replacement).size == strlen(\"3\")";
            pcVar9 = "(replacement).size";
            pcVar5 = (char *)replacement.size;
          }
          else {
            local_90 = "(1)";
            pcVar6 = "(replacement).capacity == (1)";
            pcVar9 = "(replacement).capacity";
            pcVar5 = (char *)replacement.capacity;
          }
          iVar2 = 0x6a1;
          local_88 = (char *)0x1;
        }
        else {
          local_90 = "strlen(\"012345\")";
          pcVar6 = "(string).size == strlen(\"012345\")";
          pcVar9 = "(string).size";
          iVar2 = 0x6a0;
          local_88 = (char *)0x6;
          pcVar5 = (char *)string.size;
        }
        goto LAB_0013a221;
      }
      pcVar5 = "\"";
    }
    expr = 
    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
    ;
    pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
    pcVar6 = "(string).buffer == (\"012345\")";
    pcVar9 = "(string).buffer";
    iVar2 = 0x6a0;
    local_88 = "\"";
    local_90 = "012345";
    local_98 = "\"";
    pcStack_a0 = "(\"012345\")";
    ppcVar7 = &pcStack_b0;
    pcStack_b0 = pcVar10;
    pcStack_a8 = pcVar5;
  }
  else {
    local_90 = "(8)";
    pcVar6 = "(string).capacity == (8)";
    pcVar9 = "(string).capacity";
    iVar2 = 0x6a0;
    local_88 = (char *)0x8;
    pcVar5 = (char *)string.capacity;
LAB_0013a221:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar7 = &local_90;
  }
  uStack_80 = 0;
  *(char **)((long)ppcVar7 + -8) = pcVar5;
  *(undefined8 *)((long)ppcVar7 + -0x10) = 0x13a22a;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar4,pcVar6,pcVar9);
}

Assistant:

static struct AString private_ACUtilsTest_AString_constructTestString(const char *initBuffer, size_t capacity)
{
    bool tmp = private_ACUtilsTest_AString_reallocFail;
    struct AString string = {private_ACUtilsTest_AString_realloc, private_ACUtilsTest_AString_free};
    string.size = strlen(initBuffer);
    string.capacity = capacity;
    private_ACUtilsTest_AString_reallocFail = false;
    string.buffer = (char*) string.reallocator(nullptr, string.capacity + 1);
    private_ACUtilsTest_AString_reallocFail = tmp;
    private_ACUtilsTest_AString_reallocCount = 0;
    private_ACUtilsTest_AString_freeCount = 0;
    memcpy(string.buffer, initBuffer, string.size + 1); /* +1 for '\0' */
    return string;
}